

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O1

void __thiscall MismatchedTokenException::MismatchedTokenException(MismatchedTokenException *this)

{
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Mismatched Token: expecting any AST node","");
  ParserException::ParserException(&this->super_ParserException,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&(this->super_ParserException).super_ANTLRException =
       &PTR__MismatchedTokenException_00243cd8;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tokenNames).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->token).ref = (Ref *)0x0;
  (this->node).ref = (Ref *)0x0;
  (this->tokenText)._M_dataplus._M_p = (pointer)&(this->tokenText).field_2;
  (this->tokenText)._M_string_length = 0;
  (this->tokenText).field_2._M_local_buf[0] = '\0';
  BitSet::BitSet(&this->set,0x40);
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException()
: ParserException("Mismatched Token: expecting any AST node")
, token(0)
, node(0)
{}